

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O1

int Bmc_GiaGenerateJust_rec(Gia_Man_t *p,int iFrame,int iObj,Vec_Bit_t *vValues,Vec_Bit_t *vJustis)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int unaff_EBP;
  uint uVar9;
  
  bVar3 = false;
  while (-1 < iFrame) {
    uVar9 = p->nObjs * iFrame + iObj;
    if (((int)uVar9 < 0) || (vJustis->nSize <= (int)uVar9)) {
LAB_004f9084:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                    ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
    }
    uVar8 = uVar9 >> 5;
    uVar4 = vJustis->pArray[uVar8];
    uVar7 = uVar9 & 0x1f;
    if ((uVar4 >> uVar7 & 1) != 0) break;
    vJustis->pArray[uVar8] = uVar4 | 1 << uVar7;
    if ((iObj < 0) || (p->nObjs <= iObj)) {
LAB_004f90a3:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar6 = *(ulong *)(p->pObjs + (uint)iObj);
    uVar4 = (uint)uVar6;
    if ((uVar6 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar4) {
      if ((~uVar4 & 0x9fffffff) == 0) {
        uVar9 = (uint)(uVar6 >> 0x20) & 0x1fffffff;
        iVar5 = p->vCis->nSize;
        if ((int)uVar9 < iVar5 - p->nRegs) {
          __assert_fail("Gia_ObjIsRo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1cf,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar2 = p->vCos->nSize;
        uVar9 = (iVar2 - iVar5) + uVar9;
        if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iObj = p->vCos->pArray[uVar9];
        if ((iObj < 0) || (p->nObjs <= iObj)) goto LAB_004f90a3;
        iFrame = iFrame + -1;
LAB_004f8f89:
        if (!bVar3) {
          unaff_EBP = 0;
        }
        bVar3 = true;
      }
      else {
        if (((int)uVar4 < 0) || ((int)(uVar6 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
                        ,0x3d,
                        "int Bmc_GiaGenerateJust_rec(Gia_Man_t *, int, int, Vec_Bit_t *, Vec_Bit_t *)"
                       );
        }
        if (vValues->nSize <= (int)uVar9) goto LAB_004f9084;
        pGVar1 = p->pObjs + (uint)iObj;
        if (((uint)vValues->pArray[uVar8] >> uVar7 & 1) != 0) {
          Bmc_GiaGenerateJust_rec(p,iFrame,iObj - (uVar4 & 0x1fffffff),vValues,vJustis);
          iObj = iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff);
          goto LAB_004f8f89;
        }
        uVar4 = Vec_BitEntry(vValues,uVar9 - (uVar4 & 0x1fffffff));
        uVar6 = *(ulong *)pGVar1;
        if (uVar4 != (((uint)uVar6 >> 0x1d & 1) != 0)) {
          uVar9 = Vec_BitEntry(vValues,uVar9 - ((uint)(uVar6 >> 0x20) & 0x1fffffff));
          if (uVar9 != ((*(ulong *)pGVar1 >> 0x3d & 1) != 0)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
                          ,0x47,
                          "int Bmc_GiaGenerateJust_rec(Gia_Man_t *, int, int, Vec_Bit_t *, Vec_Bit_t *)"
                         );
          }
          uVar6 = *(ulong *)pGVar1 >> 0x20;
        }
        iObj = iObj - ((uint)uVar6 & 0x1fffffff);
        if (!bVar3) {
          unaff_EBP = 0;
        }
        bVar3 = true;
      }
    }
    else {
      iObj = iObj - (uVar4 & 0x1fffffff);
      if (!bVar3) {
        unaff_EBP = 0;
      }
      bVar3 = true;
    }
  }
  iVar5 = 0;
  if (bVar3) {
    iVar5 = unaff_EBP;
  }
  return iVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Generate justifying assignments.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Bmc_GiaGenerateJust_rec( Gia_Man_t * p, int iFrame, int iObj, Vec_Bit_t * vValues, Vec_Bit_t * vJustis )
{
    Gia_Obj_t * pObj;
    int Shift = Gia_ManObjNum(p) * iFrame;
    if ( iFrame < 0 )
        return 0;
    assert( iFrame >= 0 );
    if ( Vec_BitEntry( vJustis, Shift + iObj ) )
        return 0;
    Vec_BitWriteEntry( vJustis, Shift + iObj, 1 );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCo(pObj) )
        return Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
    if ( Gia_ObjIsCi(pObj) )
        return Bmc_GiaGenerateJust_rec( p, iFrame-1, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)), vValues, vJustis );
    assert( Gia_ObjIsAnd(pObj) );
    if ( Vec_BitEntry( vValues, Shift + iObj ) )
    {
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId1(pObj, iObj), vValues, vJustis );
    }
    else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId0(pObj, iObj) ) == Gia_ObjFaninC0(pObj) )
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
    else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId1(pObj, iObj) ) == Gia_ObjFaninC1(pObj) )
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId1(pObj, iObj), vValues, vJustis );
    else assert( 0 );
    return 0;
}